

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O3

void __thiscall FConfigFile::~FConfigFile(FConfigFile *this)

{
  ~FConfigFile(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

FConfigFile::~FConfigFile ()
{
	FConfigSection *section = Sections;

	while (section != NULL)
	{
		FConfigSection *nextsection = section->Next;
		FConfigEntry *entry = section->RootEntry;

		while (entry != NULL)
		{
			FConfigEntry *nextentry = entry->Next;
			delete[] entry->Value;
			delete[] (char *)entry;
			entry = nextentry;
		}
		delete section;
		section = nextsection;
	}
}